

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::AddSegToBBox(FNodeBuilder *this,fixed_t *bbox,FPrivSeg *seg)

{
  FPrivVert *pFVar1;
  FPrivVert *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  fixed_t fVar6;
  int iVar7;
  int iVar8;
  
  pFVar2 = (this->Vertices).Array;
  pFVar1 = pFVar2 + seg->v1;
  iVar5 = seg->v2;
  iVar4 = pFVar2[seg->v1].super_FSimpleVert.x;
  fVar6 = iVar4;
  iVar3 = bbox[2];
  if (iVar4 < bbox[2]) {
    bbox[2] = iVar4;
    fVar6 = (pFVar1->super_FSimpleVert).x;
    iVar3 = iVar4;
  }
  iVar4 = bbox[3];
  if (bbox[3] < fVar6) {
    bbox[3] = fVar6;
    iVar4 = fVar6;
  }
  iVar8 = (pFVar1->super_FSimpleVert).y;
  fVar6 = iVar8;
  iVar7 = bbox[1];
  if (iVar8 < bbox[1]) {
    bbox[1] = iVar8;
    fVar6 = (pFVar1->super_FSimpleVert).y;
    iVar7 = iVar8;
  }
  pFVar2 = pFVar2 + iVar5;
  iVar5 = *bbox;
  if (*bbox < fVar6) {
    *bbox = fVar6;
    iVar5 = fVar6;
  }
  iVar8 = (pFVar2->super_FSimpleVert).x;
  if (iVar8 < iVar3) {
    bbox[2] = iVar8;
    iVar8 = (pFVar2->super_FSimpleVert).x;
  }
  if (iVar4 < iVar8) {
    bbox[3] = iVar8;
  }
  iVar4 = (pFVar2->super_FSimpleVert).y;
  if (iVar4 < iVar7) {
    bbox[1] = iVar4;
    iVar4 = (pFVar2->super_FSimpleVert).y;
  }
  if (iVar5 < iVar4) {
    *bbox = iVar4;
  }
  return;
}

Assistant:

void FNodeBuilder::AddSegToBBox (fixed_t bbox[4], const FPrivSeg *seg)
{
	FPrivVert *v1 = &Vertices[seg->v1];
	FPrivVert *v2 = &Vertices[seg->v2];

	if (v1->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v1->x;
	if (v1->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v1->x;
	if (v1->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v1->y;
	if (v1->y > bbox[BOXTOP])		bbox[BOXTOP] = v1->y;

	if (v2->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v2->x;
	if (v2->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v2->x;
	if (v2->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v2->y;
	if (v2->y > bbox[BOXTOP])		bbox[BOXTOP] = v2->y;
}